

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomLayout::write(DomLayout *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  DomProperty **ppDVar2;
  DomLayoutItem **ppDVar3;
  size_t sVar4;
  undefined4 in_register_00000034;
  QAnyStringView *size;
  long in_FS_OFFSET;
  DomLayoutItem *v_2;
  QList<DomLayoutItem_*> *__range1_2;
  DomProperty *v_1;
  QList<DomProperty_*> *__range1_1;
  DomProperty *v;
  QList<DomProperty_*> *__range1;
  char16_t *str;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  DomLayout *in_stack_fffffffffffffc18;
  DomLayoutItem *this_00;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffc20;
  QAnyStringView *pQVar5;
  QString *in_stack_fffffffffffffc28;
  DomProperty *this_01;
  QAnyStringView *in_stack_fffffffffffffc30;
  DomProperty *in_stack_fffffffffffffc38;
  undefined1 local_308 [24];
  DomLayoutItem **local_2f0;
  const_iterator local_2e8;
  const_iterator local_2e0;
  undefined1 local_2d8 [24];
  DomProperty **local_2c0;
  const_iterator local_2b8;
  const_iterator local_2b0;
  undefined1 local_2a8 [24];
  DomProperty **local_290;
  const_iterator local_288;
  const_iterator local_280 [9];
  QAnyStringView *local_238;
  QAnyStringView *local_1e8;
  QAnyStringView *local_198;
  QAnyStringView *local_148;
  QAnyStringView *local_f8;
  QAnyStringView *local_a8;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  size = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1aeccb);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"layout",6);
    QString::QString((QString *)in_stack_fffffffffffffc20,(DataPointer *)in_stack_fffffffffffffc18);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffc18->m_attr_class);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)size);
  QString::~QString((QString *)0x1aed96);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffc20);
  }
  bVar1 = hasAttributeClass(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeClass(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_58);
    QString::~QString((QString *)0x1aee5b);
    QString::~QString((QString *)0x1aee68);
  }
  bVar1 = hasAttributeName(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeName(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_a8);
    QString::~QString((QString *)0x1aef14);
    QString::~QString((QString *)0x1aef21);
  }
  bVar1 = hasAttributeStretch(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeStretch(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_f8);
    QString::~QString((QString *)0x1aefcd);
    QString::~QString((QString *)0x1aefda);
  }
  bVar1 = hasAttributeRowStretch(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeRowStretch(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_148);
    QString::~QString((QString *)0x1af086);
    QString::~QString((QString *)0x1af093);
  }
  bVar1 = hasAttributeColumnStretch(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeColumnStretch(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_198);
    QString::~QString((QString *)0x1af13f);
    QString::~QString((QString *)0x1af14c);
  }
  bVar1 = hasAttributeRowMinimumHeight(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeRowMinimumHeight(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_1e8);
    QString::~QString((QString *)0x1af1f8);
    QString::~QString((QString *)0x1af205);
  }
  bVar1 = hasAttributeColumnMinimumWidth(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    attributeColumnMinimumWidth(in_stack_fffffffffffffc18);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)size,local_238);
    QString::~QString((QString *)0x1af2b1);
    QString::~QString((QString *)0x1af2be);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_280[0].i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_280[0] = QList<DomProperty_*>::begin((QList<DomProperty_*> *)in_stack_fffffffffffffc20);
  local_288.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_288 = QList<DomProperty_*>::end((QList<DomProperty_*> *)in_stack_fffffffffffffc20);
  while( true ) {
    local_290 = local_288.i;
    bVar1 = QList<DomProperty_*>::const_iterator::operator!=(local_280,local_288);
    if (!bVar1) break;
    ppDVar2 = QList<DomProperty_*>::const_iterator::operator*(local_280);
    in_stack_fffffffffffffc38 = *ppDVar2;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    DomProperty::write(in_stack_fffffffffffffc38,__fd,local_2a8,sVar4);
    QString::~QString((QString *)0x1af3c8);
    QList<DomProperty_*>::const_iterator::operator++(local_280);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_2b0.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_2b0 = QList<DomProperty_*>::begin((QList<DomProperty_*> *)in_stack_fffffffffffffc20);
  local_2b8.i = (DomProperty **)0xaaaaaaaaaaaaaaaa;
  local_2b8 = QList<DomProperty_*>::end((QList<DomProperty_*> *)in_stack_fffffffffffffc20);
  while( true ) {
    local_2c0 = local_2b8.i;
    bVar1 = QList<DomProperty_*>::const_iterator::operator!=(&local_2b0,local_2b8);
    if (!bVar1) break;
    ppDVar2 = QList<DomProperty_*>::const_iterator::operator*(&local_2b0);
    this_01 = *ppDVar2;
    in_stack_fffffffffffffc30 = size;
    Qt::Literals::StringLiterals::operator____s((char16_t *)in_stack_fffffffffffffc38,(size_t)size);
    DomProperty::write(this_01,(int)in_stack_fffffffffffffc30,local_2d8,sVar4);
    QString::~QString((QString *)0x1af4e4);
    QList<DomProperty_*>::const_iterator::operator++(&local_2b0);
  }
  sVar4 = 0xaaaaaaaaaaaaaaaa;
  local_2e0.i = (DomLayoutItem **)0xaaaaaaaaaaaaaaaa;
  local_2e0 = QList<DomLayoutItem_*>::begin((QList<DomLayoutItem_*> *)in_stack_fffffffffffffc20);
  local_2e8.i = (DomLayoutItem **)0xaaaaaaaaaaaaaaaa;
  local_2e8 = QList<DomLayoutItem_*>::end((QList<DomLayoutItem_*> *)in_stack_fffffffffffffc20);
  while( true ) {
    local_2f0 = local_2e8.i;
    bVar1 = QList<DomLayoutItem_*>::const_iterator::operator!=(&local_2e0,local_2e8);
    if (!bVar1) break;
    ppDVar3 = QList<DomLayoutItem_*>::const_iterator::operator*(&local_2e0);
    this_00 = *ppDVar3;
    pQVar5 = size;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30);
    DomLayoutItem::write(this_00,(int)pQVar5,local_308,sVar4);
    QString::~QString((QString *)0x1af5f5);
    QList<DomLayoutItem_*>::const_iterator::operator++(&local_2e0);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayout::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layout") : tagName.toLower());

    if (hasAttributeClass())
        writer.writeAttribute(u"class"_s, attributeClass());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeStretch())
        writer.writeAttribute(u"stretch"_s, attributeStretch());

    if (hasAttributeRowStretch())
        writer.writeAttribute(u"rowstretch"_s, attributeRowStretch());

    if (hasAttributeColumnStretch())
        writer.writeAttribute(u"columnstretch"_s, attributeColumnStretch());

    if (hasAttributeRowMinimumHeight())
        writer.writeAttribute(u"rowminimumheight"_s, attributeRowMinimumHeight());

    if (hasAttributeColumnMinimumWidth())
        writer.writeAttribute(u"columnminimumwidth"_s, attributeColumnMinimumWidth());

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomProperty *v : m_attribute)
        v->write(writer, u"attribute"_s);

    for (DomLayoutItem *v : m_item)
        v->write(writer, u"item"_s);

    writer.writeEndElement();
}